

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::hasImportLinkageAttribute(uint32_t id,ValidationState_t *vstate)

{
  bool bVar1;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this;
  iterator iVar2;
  iterator iVar3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *decorations;
  ValidationState_t *vstate_local;
  uint32_t id_local;
  
  this = ValidationState_t::id_decorations(vstate,id);
  iVar2 = std::
          set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
          ::begin(this);
  iVar3 = std::
          set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
          ::end(this);
  bVar1 = std::
          any_of<std::_Rb_tree_const_iterator<spvtools::val::Decoration>,spvtools::val::(anonymous_namespace)::hasImportLinkageAttribute(unsigned_int,spvtools::val::ValidationState_t&)::__0>
                    (iVar2._M_node,iVar3._M_node);
  return bVar1;
}

Assistant:

bool hasImportLinkageAttribute(uint32_t id, ValidationState_t& vstate) {
  const auto& decorations = vstate.id_decorations(id);
  return std::any_of(
      decorations.begin(), decorations.end(), [](const Decoration& d) {
        return spv::Decoration::LinkageAttributes == d.dec_type() &&
               d.params().size() >= 2u &&
               spv::LinkageType(d.params().back()) == spv::LinkageType::Import;
      });
}